

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::BMPattern::matches(BMPattern *this,XMLCh *content,XMLSize_t start,XMLSize_t limit)

{
  XMLSize_t XVar1;
  ulong uVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  XMLCh local_6a;
  XMLCh ch;
  XMLSize_t nIndex;
  XMLSize_t patternIndex;
  XMLSize_t index;
  ArrayJanitor<char16_t> janUCContent;
  XMLCh *ucContent;
  XMLSize_t patternLen;
  XMLSize_t limit_local;
  XMLSize_t start_local;
  XMLCh *content_local;
  BMPattern *this_local;
  
  XVar1 = XMLString::stringLen(this->fPattern);
  janUCContent.fMemoryManager = (MemoryManager *)0x0;
  if (XVar1 == 0) {
    this_local._4_4_ = (int)start;
  }
  else {
    if ((this->fIgnoreCase & 1U) != 0) {
      janUCContent.fMemoryManager =
           (MemoryManager *)XMLString::replicate(content,this->fMemoryManager);
      XMLString::upperCase((XMLCh *)janUCContent.fMemoryManager);
    }
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)&index,(char16_t *)janUCContent.fMemoryManager,
               this->fMemoryManager);
    patternIndex = start + XVar1;
    while (patternIndex <= limit) {
      uVar2 = patternIndex + 1;
      local_6a = L'\0';
      nIndex = XVar1;
      while (nIndex != 0) {
        XVar3 = patternIndex - 1;
        local_6a = content[patternIndex - 1];
        XVar4 = nIndex - 1;
        patternIndex = XVar3;
        if ((local_6a != this->fPattern[nIndex - 1]) &&
           (((this->fIgnoreCase & 1U) == 0 ||
            (this->fUppercasePattern[XVar4] !=
             *(XMLCh *)((long)janUCContent.fMemoryManager + XVar3 * 2))))) break;
        nIndex = XVar4;
        if (XVar4 == 0) {
          this_local._4_4_ = (int)XVar3;
          goto LAB_0029d8ef;
        }
      }
      patternIndex = this->fShiftTable[(ulong)(ushort)local_6a % (ulong)this->fShiftTableLen] + 1 +
                     patternIndex;
      if (patternIndex < uVar2) {
        patternIndex = uVar2;
      }
    }
    this_local._4_4_ = -1;
LAB_0029d8ef:
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&index);
  }
  return this_local._4_4_;
}

Assistant:

int BMPattern::matches(const XMLCh* const content, XMLSize_t start, XMLSize_t limit) const {

    const XMLSize_t patternLen = XMLString::stringLen(fPattern);
    // Uppercase Content
    XMLCh* ucContent = 0;

    if (patternLen == 0)
        return (int)start;

    if (fIgnoreCase) {
        
        ucContent = XMLString::replicate(content, fMemoryManager);
        XMLString::upperCase(ucContent);
    }

    ArrayJanitor<XMLCh> janUCContent(ucContent, fMemoryManager);

    XMLSize_t index = start + patternLen;

    while (index <= limit) {

        XMLSize_t patternIndex = patternLen;
        XMLSize_t nIndex = index + 1;
        XMLCh ch = 0;

        while (patternIndex > 0) {

            ch = content[--index];

            if (ch != fPattern[--patternIndex]) {

                // No match, so we will break. But first we have
                // to check the ignore case flag. If it is set, then
                // we try to match with the case ignored
                if (!fIgnoreCase ||
                    (fUppercasePattern[patternIndex] != ucContent[index]))
                    break;
            }

            if (patternIndex == 0)
                return (int)index;
        }

        index += fShiftTable[ch % fShiftTableLen] + 1;

        if (index < nIndex)
            index = nIndex;
    }

    return -1;
}